

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

int xmlScanIDAttributeDecl(xmlValidCtxtPtr ctxt,xmlElementPtr elem,int err)

{
  int local_34;
  xmlAttributePtr pxStack_30;
  int ret;
  xmlAttributePtr cur;
  int err_local;
  xmlElementPtr elem_local;
  xmlValidCtxtPtr ctxt_local;
  
  local_34 = 0;
  if (elem == (xmlElementPtr)0x0) {
    ctxt_local._4_4_ = 0;
  }
  else {
    for (pxStack_30 = elem->attributes; pxStack_30 != (xmlAttributePtr)0x0;
        pxStack_30 = pxStack_30->nexth) {
      if (((pxStack_30->atype == XML_ATTRIBUTE_ID) && (local_34 = local_34 + 1, 1 < local_34)) &&
         (err != 0)) {
        xmlErrValidNode(ctxt,(xmlNodePtr)elem,XML_DTD_MULTIPLE_ID,
                        "Element %s has too many ID attributes defined : %s\n",elem->name,
                        pxStack_30->name,(xmlChar *)0x0);
      }
    }
    ctxt_local._4_4_ = local_34;
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlScanIDAttributeDecl(xmlValidCtxtPtr ctxt, xmlElementPtr elem, int err) {
    xmlAttributePtr cur;
    int ret = 0;

    if (elem == NULL) return(0);
    cur = elem->attributes;
    while (cur != NULL) {
        if (cur->atype == XML_ATTRIBUTE_ID) {
	    ret ++;
	    if ((ret > 1) && (err))
		xmlErrValidNode(ctxt, (xmlNodePtr) elem, XML_DTD_MULTIPLE_ID,
	       "Element %s has too many ID attributes defined : %s\n",
		       elem->name, cur->name, NULL);
	}
	cur = cur->nexth;
    }
    return(ret);
}